

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record-replay.cpp
# Opt level: O0

void replay_term(global_state_t *g)

{
  long lVar1;
  long in_RDI;
  replay_entry_t *entry;
  __cilkrts_worker *w;
  int i;
  replay_entry_t *this;
  int local_c;
  
  if (*(long *)(in_RDI + 0x490) != 0) {
    __cilkrts_free((void *)0x10fd39);
  }
  local_c = 0;
  do {
    if (*(int *)(in_RDI + 0xc) <= local_c) {
      return;
    }
    lVar1 = *(long *)(*(long *)(in_RDI + 0x20) + (long)local_c * 8);
    if (*(long *)(*(long *)(lVar1 + 0x38) + 0x1b0) != 0) {
      fclose(*(FILE **)(*(long *)(lVar1 + 0x38) + 0x1b0));
    }
    if (*(long *)(*(long *)(lVar1 + 0x38) + 0x1b8) != 0) {
      if (*(int *)(*(long *)(*(long *)(lVar1 + 0x38) + 0x1c0) + 8) != 4) {
        __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/record-replay.cpp"
                      ,0x2f1,"ped_type_last == w->l->replay_list_entry->m_type");
      }
      for (this = *(replay_entry_t **)(*(long *)(lVar1 + 0x38) + 0x1b8);
          this->m_type != ped_type_last; this = this + 1) {
        replay_entry_t::unload(this);
      }
      __cilkrts_free((void *)0x10fe47);
      *(undefined8 *)(*(long *)(lVar1 + 0x38) + 0x1b8) = 0;
      *(undefined8 *)(*(long *)(lVar1 + 0x38) + 0x1c0) = 0;
    }
    local_c = local_c + 1;
  } while( true );
}

Assistant:

void replay_term(global_state_t *g)
{
    // Free memory for the record/replay log file name, if we've got one
    if (g->record_replay_file_name)
        __cilkrts_free(g->record_replay_file_name);

    // Per-worker cleanup
    for(int i = 0; i < g->total_workers; ++i)
    {
        __cilkrts_worker *w = g->workers[i];

        // Close the log files, if we've opened them
        if(w->l->record_replay_fptr)
            fclose(w->l->record_replay_fptr);

        if (w->l->replay_list_root)
        {
            // We should have consumed the entire list
            CILK_ASSERT(ped_type_last == w->l->replay_list_entry->m_type);

            replay_entry_t *entry = w->l->replay_list_root;
            while (ped_type_last != entry->m_type)
            {
                // Free the pedigree memory for each entry
                entry->unload();
                entry++;
            }
            __cilkrts_free(w->l->replay_list_root);
            w->l->replay_list_root = NULL;
            w->l->replay_list_entry = NULL;
        }
    }
}